

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall btVectorX<float>::btVectorX(btVectorX<float> *this,int numRows)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  
  (this->m_storage).m_ownsMemory = true;
  (this->m_storage).m_data = (float *)0x0;
  (this->m_storage).m_size = 0;
  (this->m_storage).m_capacity = 0;
  if ((-1 < numRows) && (numRows != 0)) {
    pfVar2 = (float *)btAlignedAllocInternal((ulong)(uint)numRows * 4,0x10);
    lVar3 = (long)(this->m_storage).m_size;
    if (0 < lVar3) {
      pfVar1 = (this->m_storage).m_data;
      lVar4 = 0;
      do {
        pfVar2[lVar4] = pfVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    pfVar1 = (this->m_storage).m_data;
    if (pfVar1 != (float *)0x0) {
      if ((this->m_storage).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar1);
      }
      (this->m_storage).m_data = (float *)0x0;
    }
    (this->m_storage).m_ownsMemory = true;
    (this->m_storage).m_data = pfVar2;
    (this->m_storage).m_capacity = numRows;
    if (numRows != 0) {
      memset((this->m_storage).m_data,0,(ulong)(uint)numRows << 2);
    }
  }
  (this->m_storage).m_size = numRows;
  return;
}

Assistant:

btVectorX(int numRows)
	{
		m_storage.resize(numRows);
	}